

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupSpreadFlop(Gia_Man_t *p,Vec_Int_t *vFfMask)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  int iVar12;
  Gia_Obj_t *pObj;
  int iVar13;
  long lVar14;
  long lVar15;
  
  if (vFfMask->nSize < p->nRegs) {
    __assert_fail("Vec_IntSize(vFfMask) >= Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x379,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  iVar5 = p->nRegs;
  pVVar10 = p->vCis;
  iVar13 = pVVar10->nSize;
  if (iVar5 < iVar13) {
    lVar14 = 0;
    do {
      if (iVar13 <= lVar14) goto LAB_001dbb4e;
      iVar13 = pVVar10->pArray[lVar14];
      if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001dbb2f;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_001dbb10;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_001dbb10;
      pGVar3[iVar13].Value = (int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      iVar5 = p->nRegs;
      pVVar10 = p->vCis;
      iVar13 = pVVar10->nSize;
    } while (lVar14 < iVar13 - iVar5);
  }
  if (vFfMask->nSize < 1) {
    iVar13 = 0;
  }
  else {
    lVar14 = 0;
    iVar13 = 0;
    do {
      iVar5 = vFfMask->pArray[lVar14];
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_00->pObjs;
      if (iVar5 == -1) {
        if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) goto LAB_001dbb10;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
        if ((pGVar9 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar9)) goto LAB_001dbb10;
      }
      else {
        if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) {
LAB_001dbb10:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) goto LAB_001dbb10;
        if (p->nRegs <= iVar13) {
          __assert_fail("v < Gia_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d6,"Gia_Obj_t *Gia_ManRo(Gia_Man_t *, int)");
        }
        iVar5 = p->vCis->nSize;
        uVar11 = (iVar5 - p->nRegs) + iVar13;
        if (((int)uVar11 < 0) || (iVar5 <= (int)uVar11)) goto LAB_001dbb4e;
        iVar5 = p->vCis->pArray[uVar11];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001dbb2f;
        iVar13 = iVar13 + 1;
        p->pObjs[iVar5].Value = (int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * 0x55555556;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < vFfMask->nSize);
    iVar5 = p->nRegs;
  }
  if (iVar13 != iVar5) {
    __assert_fail("k == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x386,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar13 = p->nObjs;
  if (0 < iVar13) {
    lVar14 = 8;
    lVar15 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)((long)pGVar3 + lVar14 + -8);
      if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
        uVar11 = *(uint *)((long)pGVar3 +
                          lVar14 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3);
        if (((int)uVar11 < 0) ||
           (uVar1 = *(uint *)((long)pGVar3 +
                             lVar14 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_001dbb6d;
        iVar13 = Gia_ManAppendAnd(p_00,uVar11 ^ (uint)(uVar4 >> 0x1d) & 1,
                                  uVar1 ^ (uint)(uVar4 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar14) = iVar13;
        iVar13 = p->nObjs;
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar15 < iVar13);
    iVar5 = p->nRegs;
  }
  pVVar10 = p->vCos;
  iVar13 = pVVar10->nSize;
  if (iVar5 < iVar13) {
    lVar14 = 0;
    do {
      if (iVar13 <= lVar14) goto LAB_001dbb4e;
      iVar13 = pVVar10->pArray[lVar14];
      if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001dbb2f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar13;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0)
      goto LAB_001dbb6d;
      uVar11 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                    pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value
                              );
      pGVar3->Value = uVar11;
      lVar14 = lVar14 + 1;
      iVar5 = p->nRegs;
      pVVar10 = p->vCos;
      iVar13 = pVVar10->nSize;
    } while (lVar14 < iVar13 - iVar5);
  }
  iVar13 = vFfMask->nSize;
  if (iVar13 < 1) {
    iVar12 = 0;
  }
  else {
    lVar14 = 0;
    iVar12 = 0;
    do {
      if (vFfMask->pArray[lVar14] == -1) {
        Gia_ManAppendCo(p_00,0);
      }
      else {
        if (p->nRegs <= iVar12) {
          __assert_fail("v < Gia_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d7,"Gia_Obj_t *Gia_ManRi(Gia_Man_t *, int)");
        }
        iVar13 = p->vCos->nSize;
        uVar11 = (iVar13 - p->nRegs) + iVar12;
        if (((int)uVar11 < 0) || (iVar13 <= (int)uVar11)) {
LAB_001dbb4e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar13 = p->vCos->pArray[uVar11];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) {
LAB_001dbb2f:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar3 = p->pObjs + iVar13;
        if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_001dbb6d:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar12 = iVar12 + 1;
        uVar11 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                      pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].
                                      Value);
        pGVar3->Value = uVar11;
      }
      lVar14 = lVar14 + 1;
      iVar13 = vFfMask->nSize;
    } while (lVar14 < iVar13);
    iVar5 = p->nRegs;
  }
  if (iVar12 == iVar5) {
    Gia_ManSetRegNum(p_00,iVar13);
    return p_00;
  }
  __assert_fail("k == Gia_ManRegNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x394,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupSpreadFlop( Gia_Man_t * p, Vec_Int_t * vFfMask )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, k, Entry;
    assert( Vec_IntSize(vFfMask) >= Gia_ManRegNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    k = 0;
    Vec_IntForEachEntry( vFfMask, Entry, i )
        if ( Entry == -1 )
            Gia_ManAppendCi(pNew);
        else
            Gia_ManRo(p, k++)->Value = Gia_ManAppendCi(pNew);
    assert( k == Gia_ManRegNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    k = 0;
    Vec_IntForEachEntry( vFfMask, Entry, i )
        if ( Entry == -1 )
            Gia_ManAppendCo( pNew, 0 );
        else
        {
            pObj = Gia_ManRi( p, k++ );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
    assert( k == Gia_ManRegNum(p) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vFfMask) );
    return pNew;
}